

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic_impl.c
# Opt level: O2

void hash_commitment(picnic_instance_t *pp,proof_round_t *prf_round,uint vidx)

{
  ulong digest_size;
  uint8_t tmp [64];
  hash_context ctx;
  
  digest_size = (ulong)pp->digest_size;
  hash_init_prefix(&ctx,digest_size,'\x04');
  hash_update(&ctx,prf_round->seeds[vidx],(ulong)pp->seed_size);
  hash_final(&ctx);
  hash_squeeze(&ctx,tmp,digest_size);
  hash_init_prefix(&ctx,digest_size,'\0');
  hash_update(&ctx,tmp,digest_size);
  hash_update(&ctx,prf_round->input_shares[vidx],(ulong)pp->input_output_size);
  hash_update(&ctx,prf_round->communicated_bits[vidx],(ulong)pp->view_size);
  hash_update(&ctx,prf_round->output_shares[vidx],(ulong)pp->input_output_size);
  hash_final(&ctx);
  hash_squeeze(&ctx,prf_round->commitments[vidx],digest_size);
  return;
}

Assistant:

static void hash_commitment(const picnic_instance_t* pp, proof_round_t* prf_round,
                            const unsigned int vidx) {
  const unsigned int hashlen = pp->digest_size;

  hash_context ctx;
  // hash the seed
  hash_init_prefix(&ctx, hashlen, HASH_PREFIX_4);
  hash_update(&ctx, prf_round->seeds[vidx], pp->seed_size);
  hash_final(&ctx);
  uint8_t tmp[MAX_DIGEST_SIZE];
  hash_squeeze(&ctx, tmp, hashlen);
  hash_clear(&ctx);

  // compute H_0(H_4(seed), view)
  hash_init_prefix(&ctx, hashlen, HASH_PREFIX_0);
  hash_update(&ctx, tmp, hashlen);
  // hash input share
  hash_update(&ctx, prf_round->input_shares[vidx], pp->input_output_size);
  // hash communicated bits
  hash_update(&ctx, prf_round->communicated_bits[vidx], pp->view_size);
  // hash output share
  hash_update(&ctx, prf_round->output_shares[vidx], pp->input_output_size);
  hash_final(&ctx);
  hash_squeeze(&ctx, prf_round->commitments[vidx], hashlen);
  hash_clear(&ctx);
}